

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleManager.h
# Opt level: O0

void __thiscall Scine::Core::ModuleManager::Impl::tryLoadModulesInPath(Impl *this,path *directory)

{
  bool bVar1;
  path *in_RDI;
  directory_iterator end;
  directory_iterator *in_stack_ffffffffffffffa8;
  directory_iterator *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  directory_options opts;
  anon_class_8_1_8991fb9c in_stack_ffffffffffffffc8;
  directory_iterator *in_stack_ffffffffffffffd0;
  
  opts = (directory_options)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  bVar1 = boost::filesystem::is_directory(in_RDI);
  if (bVar1) {
    boost::filesystem::directory_iterator::directory_iterator((directory_iterator *)0x135ef2);
    boost::filesystem::directory_iterator::directory_iterator
              (in_stack_ffffffffffffffd0,(path *)in_stack_ffffffffffffffc8.this,opts);
    boost::filesystem::directory_iterator::directory_iterator
              ((directory_iterator *)in_RDI,in_stack_ffffffffffffffa8);
    std::
    for_each<boost::filesystem::directory_iterator,Scine::Core::ModuleManager::Impl::tryLoadModulesInPath(boost::filesystem::path_const&)::_lambda(auto:1_const&)_1_>
              ((directory_iterator *)in_RDI,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffc8);
    boost::filesystem::directory_iterator::~directory_iterator((directory_iterator *)0x135f4d);
    boost::filesystem::directory_iterator::~directory_iterator((directory_iterator *)0x135f57);
    boost::filesystem::directory_iterator::~directory_iterator((directory_iterator *)0x135f61);
  }
  return;
}

Assistant:

void tryLoadModulesInPath(const boost::filesystem::path& directory) {
    if (!boost::filesystem::is_directory(directory)) {
      return;
    }

    const boost::filesystem::directory_iterator end;
    std::for_each(boost::filesystem::directory_iterator(directory), end, [&](const auto& filePath) {
      if (patternMatchModuleLibrary(filePath.path().filename().string())) {
        try {
          this->load(filePath);
        }
        catch (...) {
        }
      }
    });
  }